

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O0

int make_vbap_2d(vbap_data *data)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  int local_150;
  int local_14c;
  int i_3;
  int i_2;
  int j;
  int smallest;
  float smallest_angle;
  int i_1;
  int sorted [33];
  int local_ac;
  float local_a8;
  int i;
  float azimuth [33];
  int set_count;
  mixed_channel_t speaker_count;
  vbap_data *data_local;
  
  bVar1 = data->speaker_count;
  azimuth[0x20] = 0.0;
  for (local_ac = 0; local_ac < (int)(uint)bVar1; local_ac = local_ac + 1) {
    dVar4 = acos((double)data->speakers[local_ac][0]);
    (&local_a8)[local_ac] = (float)((dVar4 * 360.0) / 6.283185307179586);
    if (0.001 < ABS(data->speakers[local_ac][2])) {
      (&local_a8)[local_ac] =
           (&local_a8)[local_ac] * (data->speakers[local_ac][2] / ABS(data->speakers[local_ac][2]));
    }
  }
  for (smallest = 0; smallest < (int)(uint)bVar1; smallest = smallest + 1) {
    j = 0x44800000;
    i_2 = 0;
    for (i_3 = 0; i_3 < (int)(uint)bVar1; i_3 = i_3 + 1) {
      if ((&local_a8)[i_3] < (float)j) {
        j = (int)(&local_a8)[i_3];
        i_2 = i_3;
      }
    }
    (&smallest_angle)[smallest] = (float)i_2;
    (&local_a8)[i_2] = (&local_a8)[i_2] + 2048.0;
  }
  for (local_14c = 0; local_14c < (int)(uint)bVar1; local_14c = local_14c + 1) {
    (&local_a8)[local_14c] = (&local_a8)[local_14c] - 2048.0;
  }
  for (local_150 = 0; local_150 < (int)(bVar1 - 1); local_150 = local_150 + 1) {
    if ((&local_a8)[local_150 + 1] - (&local_a8)[local_150] <= 170.0) {
      data->sets[(int)azimuth[0x20]].speakers[0] = SUB41((&smallest_angle)[local_150],0);
      data->sets[(int)azimuth[0x20]].speakers[1] = SUB41((&smallest_angle)[local_150 + 1],0);
      data->sets[(int)azimuth[0x20]].speakers[2] = 0xff;
      iVar2 = compute_set_matrix_2d((int)azimuth[0x20],&local_a8,data);
      if (iVar2 != 0) {
        azimuth[0x20] = (float)((int)azimuth[0x20] + 1);
      }
    }
  }
  if ((360.0 - (&local_a8)[(int)(&smallest_angle)[(int)(bVar1 - 1)]]) +
      (&local_a8)[(int)smallest_angle] <= 170.0) {
    data->sets[(int)azimuth[0x20]].speakers[0] = SUB41((&smallest_angle)[(int)(bVar1 - 1)],0);
    data->sets[(int)azimuth[0x20]].speakers[1] = SUB41(smallest_angle,0);
    data->sets[(int)azimuth[0x20]].speakers[2] = 0xff;
    iVar2 = compute_set_matrix_2d((int)azimuth[0x20],&local_a8,data);
    if (iVar2 != 0) {
      azimuth[0x20] = (float)((int)azimuth[0x20] + 1);
    }
  }
  bVar3 = azimuth[0x20] != 0.0;
  if (bVar3) {
    data->set_count = (int)azimuth[0x20];
  }
  else {
    mixed_err(8);
  }
  data_local._4_4_ = (uint)bVar3;
  return data_local._4_4_;
}

Assistant:

int make_vbap_2d(struct vbap_data *data){
  mixed_channel_t speaker_count = data->speaker_count;
  int set_count = 0;

  // Get azimuth angles in [-180, +180]
  float azimuth[MIXED_MAX_SPEAKER_COUNT];
  for(int i=0; i<speaker_count; ++i){
    azimuth[i] = acos(data->speakers[i][0]) * RAD2DEG;
    if(0.001 < fabs(data->speakers[i][2])){
      azimuth[i] *= data->speakers[i][2] / fabs(data->speakers[i][2]);
    }
  }
  
  // Sort the speakers by angle
  int sorted[MIXED_MAX_SPEAKER_COUNT];
  for(int i=0; i<speaker_count; ++i){
    float smallest_angle = 1024.0;
    int smallest = 0;
    for(int j=0; j<speaker_count; ++j){
      if(azimuth[j] < smallest_angle){
        smallest_angle = azimuth[j];
        smallest = j;
      }
    }
    sorted[i] = smallest;
    // Bias this one to not get picked again.
    azimuth[smallest] += 2048.0;
  }
  // Undo the bias.
  for(int i=0; i<speaker_count; ++i){
    azimuth[i] -= 2048.0;
  }

  // Construct pairs based on adjacent speakers
  for(int i=0; i<speaker_count-1; ++i){
    if(azimuth[i+1] - azimuth[i] <= (170)){
      data->sets[set_count].speakers[0] = sorted[i];
      data->sets[set_count].speakers[1] = sorted[i+1];
      data->sets[set_count].speakers[2] = -1;
      if(compute_set_matrix_2d(set_count, azimuth, data)){
        ++set_count;
      }
    }
  }
  if(360 - azimuth[sorted[speaker_count-1]] + azimuth[sorted[0]] <= 170){
      data->sets[set_count].speakers[0] = sorted[speaker_count-1];
      data->sets[set_count].speakers[1] = sorted[0];
      data->sets[set_count].speakers[2] = -1;
      if(compute_set_matrix_2d(set_count, azimuth, data)){
        ++set_count;
      }
  }

  if(set_count == 0){
    mixed_err(MIXED_INVALID_VALUE);
    return 0;
  }
  
  data->set_count = set_count;
  return 1;
}